

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv__signal_unlock(void)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  undefined1 local_d;
  int local_c;
  char data;
  int r;
  
  local_d = 0x2a;
  do {
    sVar2 = write(uv__signal_lock_pipefd[1],&local_d,1);
    local_c = (int)sVar2;
    bVar4 = false;
    if (local_c < 0) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  iVar1 = 0;
  if (local_c < 0) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int uv__signal_unlock(void) {
  int r;
  char data = 42;

  do {
    r = write(uv__signal_lock_pipefd[1], &data, sizeof data);
  } while (r < 0 && errno == EINTR);

  return (r < 0) ? -1 : 0;
}